

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O3

void gen_lxvd2x(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGContext_conflict10 *pTVar1;
  uint uVar2;
  TCGTemp *a1;
  TCGTemp *pTVar3;
  TCGv_i64 arg;
  uintptr_t o_1;
  uintptr_t o_5;
  TCGv_i64 val;
  uintptr_t o;
  TCGv_i64 ret;
  
  if (ctx->vsx_enabled == false) {
    gen_exception(ctx,0x5e);
    return;
  }
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
    pTVar1 = ctx->uc->tcg_ctx;
    tcg_gen_op2_ppc64(pTVar1,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar1),0x20);
    ctx->access_type = 0x20;
  }
  val = (TCGv_i64)((long)a1 - (long)s);
  pTVar3 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar1 = ctx->uc->tcg_ctx;
  uVar2 = ctx->opcode >> 0x10 & 0x1f;
  arg = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
  if (uVar2 == 0) {
    if (ctx->sf_mode != false) {
      if (arg != ret) {
        tcg_gen_op2_ppc64(pTVar1,INDEX_op_mov_i64,(TCGArg)((long)pTVar1 + (long)ret),
                          (TCGArg)(arg + (long)pTVar1));
      }
      goto LAB_00bb3ff8;
    }
  }
  else {
    tcg_gen_op3_ppc64(pTVar1,INDEX_op_add_i64,(TCGArg)((long)pTVar1 + (long)ret),
                      (TCGArg)((long)&pTVar1->pool_cur + (long)cpu_gpr[uVar2]),
                      (TCGArg)(arg + (long)pTVar1));
    arg = ret;
    if (ctx->sf_mode != false) goto LAB_00bb3ff8;
  }
  tcg_gen_ext32u_i64_ppc64(pTVar1,ret,arg);
LAB_00bb3ff8:
  tcg_gen_qemu_ld_i64_ppc64
            (ctx->uc->tcg_ctx,val,ret,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_64);
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)a1,(TCGArg)(s->cpu_env + (long)s),
                    (ulong)((ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5) * 0x10 + 0x12b28))
  ;
  tcg_gen_addi_i64_ppc64(s,ret,ret,8);
  tcg_gen_qemu_ld_i64_ppc64
            (ctx->uc->tcg_ctx,val,ret,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_64);
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)a1,(TCGArg)(s->cpu_env + (long)s),
                    (ulong)((ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5) * 0x10 + 0x12b20))
  ;
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(val + (long)s));
  return;
}

Assistant:

static void gen_lxvd2x(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 t0;
    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    t0 = tcg_temp_new_i64(tcg_ctx);
    gen_set_access_type(ctx, ACCESS_INT);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    gen_qemu_ld64_i64(ctx, t0, EA);
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), t0);
    tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
    gen_qemu_ld64_i64(ctx, t0, EA);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), t0);
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, t0);
}